

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArithmeticSubtermGeneralization.cpp
# Opt level: O3

Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> * __thiscall
Inferences::intersectSortedStack<Inferences::AnyNumber<Kernel::MonomFactor>>
          (Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *__return_storage_ptr__,
          Inferences *this,Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *l,
          Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *r)

{
  bool bVar1;
  ResultOf<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Coproduct_hpp:647:37),_Constant<0>_>
  RVar2;
  Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *pSVar3;
  byte bVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  AnyNumber<Kernel::MonomFactor> *pAVar8;
  AnyNumber<Kernel::MonomFactor> *pAVar9;
  AnyNumber<Kernel::MonomFactor> *pAVar10;
  Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
  *lhs;
  RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>
  *this_00;
  uint uVar11;
  anon_class_16_2_441c8d4f f;
  uint local_44;
  
  pAVar8 = *(AnyNumber<Kernel::MonomFactor> **)(this + 8);
  pAVar10 = *(AnyNumber<Kernel::MonomFactor> **)(this + 0x10);
  uVar5 = (long)pAVar10 - (long)pAVar8;
  pAVar9 = pAVar8;
  pSVar3 = (Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *)this;
  if (pAVar10 != pAVar8) {
    pAVar9 = l->_stack;
    pAVar10 = l->_cursor;
    pSVar3 = l;
    if (pAVar10 != pAVar9) {
      pSVar3 = (Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *)this;
      if ((ulong)((long)pAVar10 - (long)pAVar9) < uVar5) {
        pSVar3 = l;
      }
      uVar5 = 0;
      uVar6 = 0;
      uVar11 = 0;
      local_44 = 0;
      do {
        uVar7 = (ulong)uVar6;
        if ((ulong)((long)l->_cursor - (long)l->_stack >> 5) <= uVar7) break;
        bVar1 = Lib::operator==(&pAVar8[uVar5].
                                 super_Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                                ,&l->_stack[uVar7].
                                  super_Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                               );
        this_00 = (RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>
                   *)(uVar5 * 0x20 + *(long *)(this + 8));
        if (bVar1) {
          uVar5 = (ulong)local_44;
          local_44 = local_44 + 1;
          Lib::CoproductImpl::TrivialOperations::CopyCons::
          DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
          ::operator=((DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                       *)(pSVar3->_stack + uVar5),
                      (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                       *)this_00);
          uVar11 = uVar11 + 1;
LAB_004921fe:
          uVar6 = uVar6 + 1;
        }
        else {
          bVar4 = *(byte *)&l->_stack[uVar7].
                            super_Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                            ._inner.
                            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                            .
                            super_RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                  & 3;
          if (((byte)*this_00 & 3) != bVar4) {
            if (((byte)*this_00 & 3) < bVar4) goto LAB_00492204;
            goto LAB_004921fe;
          }
          f.rhs = &l->_stack[uVar7].
                   super_Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
          ;
          f.lhs = (Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                   *)this_00;
          RVar2 = Lib::CoproductImpl::
                  RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>
                  ::operator()(this_00,f);
          if (RVar2 != LESS) goto LAB_004921fe;
LAB_00492204:
          uVar11 = uVar11 + 1;
        }
        uVar5 = (ulong)uVar11;
        pAVar8 = *(AnyNumber<Kernel::MonomFactor> **)(this + 8);
      } while (uVar5 < (ulong)(*(long *)(this + 0x10) - (long)pAVar8 >> 5));
      pAVar9 = pSVar3->_stack;
      pAVar10 = pAVar9 + local_44;
    }
  }
  __return_storage_ptr__->_capacity = pSVar3->_capacity;
  pSVar3->_capacity = 0;
  __return_storage_ptr__->_cursor = pAVar10;
  pSVar3->_cursor = (AnyNumber<Kernel::MonomFactor> *)0x0;
  __return_storage_ptr__->_end = pSVar3->_end;
  pSVar3->_end = (AnyNumber<Kernel::MonomFactor> *)0x0;
  __return_storage_ptr__->_stack = pAVar9;
  pSVar3->_stack = (AnyNumber<Kernel::MonomFactor> *)0x0;
  return __return_storage_ptr__;
}

Assistant:

Stack<C> intersectSortedStack(Stack<C>&& l, Stack<C>&& r) 
{
  // DEBUG("lhs: ", l)
  // DEBUG("rhs: ", r)

  if (l.size() == 0) return std::move(l);
  if (r.size() == 0) return std::move(r);

  unsigned outOffs = 0;
  auto& out = l.size() <= r.size() ? l : r;
  unsigned loffs = 0;
  unsigned roffs = 0;
  while (loffs < l.size() && roffs < r.size()) {
    if (l[loffs] == r[roffs]) {
      out[outOffs++] = l[loffs];
      loffs++;
      roffs++;
    } else if(l[loffs] < r[roffs]) {
      loffs++;
    } else {
      roffs++;
    }
  }
  
  out.truncate(outOffs);
  //DEBUG("out: ", out);
  return std::move(out);
}